

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O2

uint * Aig_ManCutTruthOne(Aig_Obj_t *pNode,uint *pTruth,int nWords)

{
  Aig_Obj_t *pAVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pAVar1 = pNode->pFanin1;
  lVar2 = *(long *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x28);
  lVar3 = *(long *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x28);
  if ((*(uint *)&pNode->field_0x18 & 7) == 6) {
    uVar4 = 0;
    uVar5 = (ulong)(uint)nWords;
    if (nWords < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pTruth[uVar4] = *(uint *)(lVar3 + uVar4 * 4) ^ *(uint *)(lVar2 + uVar4 * 4);
    }
  }
  else {
    uVar5 = 0;
    if (0 < nWords) {
      uVar5 = (ulong)(uint)nWords;
    }
    uVar4 = 0;
    if (((ulong)pNode->pFanin0 & 1) == 0) {
      if (((ulong)pAVar1 & 1) == 0) {
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          pTruth[uVar4] = *(uint *)(lVar3 + uVar4 * 4) & *(uint *)(lVar2 + uVar4 * 4);
        }
      }
      else {
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          pTruth[uVar4] = ~*(uint *)(lVar3 + uVar4 * 4) & *(uint *)(lVar2 + uVar4 * 4);
        }
      }
    }
    else if (((ulong)pAVar1 & 1) == 0) {
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        pTruth[uVar4] = ~*(uint *)(lVar2 + uVar4 * 4) & *(uint *)(lVar3 + uVar4 * 4);
      }
    }
    else {
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        pTruth[uVar4] = ~(*(uint *)(lVar3 + uVar4 * 4) | *(uint *)(lVar2 + uVar4 * 4));
      }
    }
  }
  return pTruth;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes truth table of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
unsigned * Aig_ManCutTruthOne( Aig_Obj_t * pNode, unsigned * pTruth, int nWords )
{
    unsigned * pTruth0, * pTruth1;
    int i;
    pTruth0 = (unsigned *)Aig_ObjFanin0(pNode)->pData;
    pTruth1 = (unsigned *)Aig_ObjFanin1(pNode)->pData;
    if ( Aig_ObjIsExor(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Aig_ObjFaninC0(pNode) && !Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Aig_ObjFaninC0(pNode) && Aig_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}